

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

void dmrC_die(dmr_C *C,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list args;
  char *fmt_local;
  dmr_C *C_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  vsnprintf(dmrC_die::buffer,0x200,fmt,&local_38);
  fprintf(_stderr,"%s\n",dmrC_die::buffer);
  longjmp((__jmp_buf_tag *)C->jmpbuf,1);
}

Assistant:

void dmrC_die(struct dmr_C *C, const char *fmt, ...)
{
	va_list args;
	static char buffer[512];

	(void)C;
	va_start(args, fmt);
	vsnprintf(buffer, sizeof(buffer), fmt, args);
	va_end(args);

	fprintf(stderr, "%s\n", buffer);
	longjmp(C->jmpbuf, 1);
}